

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::ComputeAllImmediateRewards
          (BayesianGameForDecPOMDPStage *this,FactoredDecPOMDPDiscreteInterface *fd)

{
  pointer pvVar1;
  long lVar2;
  size_t __n;
  size_t __n_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  allocator_type local_92;
  allocator_type local_91;
  size_t local_90;
  vector<double,_std::allocator<double>_> local_88;
  value_type_conflict3 local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  if (this->_m_areCachedImmediateRewards == true) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_erase_at_end(&this->_m_immR,
                      (this->_m_immR).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  __n = BayesianGameBase::GetNrJointTypes
                  ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  __n_00 = BayesianGameBase::GetNrJointActions
                     ((BayesianGameBase *)&this->super_BayesianGameIdenticalPayoff);
  local_70 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__n_00,&local_70,&local_91);
  local_90 = __n;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_68,__n,&local_88,&local_92);
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->_m_immR).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->_m_immR).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_m_immR).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_m_immR).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90 != 0) {
    uVar5 = 0;
    do {
      if (__n_00 != 0) {
        uVar6 = 0;
        do {
          dVar7 = ComputeImmediateReward(this,(Index)uVar5,(Index)uVar6);
          pvVar1 = (this->_m_immR).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = ((long)(this->_m_immR).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                  -0x5555555555555555;
          uVar4 = uVar5;
          if ((uVar3 < uVar5 || uVar3 - uVar5 == 0) ||
             (lVar2 = *(long *)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data, uVar4 = uVar6,
             (ulong)((long)*(pointer *)
                            ((long)&pvVar1[uVar5].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) - lVar2 >> 3) <= uVar6)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar4);
          }
          *(double *)(lVar2 + uVar6 * 8) = dVar7;
          uVar6 = (ulong)((Index)uVar6 + 1);
        } while (uVar6 < __n_00);
      }
      uVar5 = (ulong)((Index)uVar5 + 1);
    } while (uVar5 < local_90);
  }
  this->_m_areCachedImmediateRewards = true;
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::
ComputeAllImmediateRewards(const FactoredDecPOMDPDiscreteInterface *fd)
{
    if(_m_areCachedImmediateRewards)
        _m_immR.clear();

    size_t nrJT = GetNrJointTypes();
    size_t nrJA = GetNrJointActions();
    _m_immR = vector< vector <double> >(nrJT, vector<double>(nrJA, 0.0) );

    for(Index jtI=0; jtI< nrJT; jtI++)
        for(Index jaI=0; jaI< nrJA; jaI++)
            _m_immR.at(jtI).at(jaI) = ComputeImmediateReward(jtI, jaI);

    _m_areCachedImmediateRewards = true;
}